

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_geninfo.c
# Opt level: O0

mpt_metatype * mpt_meta_geninfo(size_t post)

{
  int iVar1;
  ulong dlen;
  int *piVar2;
  mpt_metatype *mt;
  size_t post_local;
  
  iVar1 = _mpt_geninfo_size(post + 1);
  dlen = (ulong)iVar1;
  if (dlen < 0x100) {
    post_local = (size_t)malloc(dlen + 8);
    if ((undefined8 *)post_local == (undefined8 *)0x0) {
      post_local = 0;
    }
    else {
      iVar1 = _mpt_geninfo_init((undefined8 *)(post_local + 8),dlen);
      if (iVar1 < 0) {
        free((void *)post_local);
        post_local = 0;
      }
      else {
        *(_mpt_vptr_metatype **)post_local = &mpt_meta_geninfo::_vptr_control;
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    post_local = 0;
  }
  return (mpt_metatype *)post_local;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_meta_geninfo(size_t post)
{
	static const MPT_INTERFACE_VPTR(metatype) _vptr_control = {
		{ metaConv },
		metaUnref,
		metaRef,
		metaClone
	};
	MPT_INTERFACE(metatype) *mt;
	
	post = _mpt_geninfo_size(post + 1);
	if (post > UINT8_MAX) {
		errno = EINVAL;
		return 0;
	}
	if (!(mt = malloc(sizeof(*mt) + post))) {
		return 0;
	}
	/* initial settings */
	if (_mpt_geninfo_init(mt + 1, post) < 0) {
		free(mt);
		return 0;
	}
	mt->_vptr = &_vptr_control;
	
	return mt;
}